

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::logShader
               (TestLog *log,RenderContext *renderCtx,Shader *shader)

{
  deUint32 shader_00;
  ShaderType shaderType;
  qpShaderType type;
  LogShader local_d8;
  undefined1 local_78 [8];
  ShaderInfo info;
  Shader *shader_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  
  info.compileTimeUs = (deUint64)shader;
  glu::ShaderInfo::ShaderInfo((ShaderInfo *)local_78);
  shader_00 = glu::Shader::getShader((Shader *)info.compileTimeUs);
  queryShaderInfo(renderCtx,shader_00,(ShaderInfo *)local_78);
  shaderType = glu::Shader::getType((Shader *)info.compileTimeUs);
  type = glu::getLogShaderType(shaderType);
  tcu::LogShader::LogShader
            (&local_d8,type,(string *)&info,(bool)(info.infoLog.field_2._M_local_buf[8] & 1),
             (string *)((long)&info.source.field_2 + 8));
  tcu::TestLog::operator<<(log,&local_d8);
  tcu::LogShader::~LogShader(&local_d8);
  glu::ShaderInfo::~ShaderInfo((ShaderInfo *)local_78);
  return;
}

Assistant:

void logShader (TestLog& log, glu::RenderContext& renderCtx, glu::Shader& shader)
{
	glu::ShaderInfo info;

	queryShaderInfo(renderCtx, shader.getShader(), info);

	log << TestLog::Shader(getLogShaderType(shader.getType()), info.source, info.compileOk, info.infoLog);
}